

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

char * chaiscript::boxed_cast<char&>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  char *pcVar5;
  undefined8 *puVar6;
  Type_Info local_68;
  undefined *local_50;
  undefined *local_48;
  undefined4 local_40;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68.m_type_info = (type_info *)&char::typeinfo;
    local_68.m_bare_type_info = (type_info *)&char::typeinfo;
    local_68.m_flags = 0x12;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,&local_68);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<char&>(*(Type_Conversions **)t_conversions),
       bVar4)) {
      if ((t_conversions != (Type_Conversions_State *)0x0) &&
         (bVar4 = Type_Conversions::convertable_type<char&>(*(Type_Conversions **)t_conversions),
         bVar4)) {
        local_50 = &char::typeinfo;
        local_48 = &char::typeinfo;
        local_40 = 0x12;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)&local_68,*(Type_Info **)t_conversions,
                   (Conversion_Saves *)&local_50,*(Boxed_Value **)(t_conversions + 8));
        pcVar5 = (char *)detail::verify_type<void>
                                   ((Boxed_Value *)&local_68,(type_info *)&char::typeinfo,
                                    *(void **)(local_68.m_type_info + 0x20));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.m_bare_type_info ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return pcVar5;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.m_bare_type_info);
        return pcVar5;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68.m_flags = (peVar1->m_type_info).m_flags;
      local_68._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      ptVar2 = (peVar1->m_type_info).m_type_info;
      ptVar3 = (peVar1->m_type_info).m_bare_type_info;
      *puVar6 = &PTR__bad_cast_0019ca28;
      local_68.m_type_info._0_4_ = SUB84(ptVar2,0);
      local_68.m_type_info._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      local_68.m_bare_type_info._0_4_ = SUB84(ptVar3,0);
      local_68.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_68.m_type_info._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_68.m_type_info._4_4_;
      *(undefined4 *)(puVar6 + 2) = local_68.m_bare_type_info._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = local_68.m_bare_type_info._4_4_;
      puVar6[3] = local_68._16_8_;
      puVar6[4] = &char::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_68.m_type_info = ptVar2;
      local_68.m_bare_type_info = ptVar3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  pcVar5 = (char *)detail::verify_type<void>
                             (bv,(type_info *)&char::typeinfo,
                              ((bv->m_data).
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_data_ptr);
  return pcVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }